

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

float __thiscall
duckdb::Interpolator<true>::Operation<float,float,duckdb::QuantileDirect<float>>
          (Interpolator<true> *this,float *v_t,Vector *result,QuantileDirect<float> *accessor)

{
  RESULT_TYPE_conflict3 input;
  float fVar1;
  
  input = InterpolateInternal<float,duckdb::QuantileDirect<float>>(this,v_t,accessor);
  fVar1 = Cast::Operation<float,float>(input);
  return fVar1;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}